

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalVar *var)

{
  ExternalRef local_8;
  
  if (var->var->type_ == Name) {
    local_8.name = (string *)&var->var->field_2;
    Write(this,&local_8);
    return;
  }
  __assert_fail("var.var.is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/c-writer.cc"
                ,0x2d2,"void wabt::(anonymous namespace)::CWriter::Write(const GlobalVar &)");
}

Assistant:

void CWriter::Write(const GlobalVar& var) {
  assert(var.var.is_name());
  Write(ExternalRef(var.var.name()));
}